

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::HasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  long lVar5;
  cmake *this_01;
  bool local_2a9;
  undefined1 local_290 [16];
  string local_280;
  undefined1 local_260 [8];
  cmake *cm;
  ostringstream w;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  string install_name_1;
  ImportInfo *info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  byte local_65;
  bool use_install_name;
  allocator<char> local_51;
  string local_50;
  _Base_ptr local_30;
  char *install_name;
  bool macosx_rpath;
  string *psStack_20;
  bool install_name_is_rpath;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  install_name._7_1_ = 0;
  install_name._6_1_ = 0;
  psStack_20 = config;
  config_local = (string *)this;
  bVar1 = IsImported(this);
  if (bVar1) {
    install_name_1.field_2._8_8_ = GetImportInfo(this,psStack_20);
    if ((ImportInfo *)install_name_1.field_2._8_8_ != (ImportInfo *)0x0) {
      if (((((ImportInfo *)install_name_1.field_2._8_8_)->NoSOName & 1U) == 0) &&
         (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        lVar5 = std::__cxx11::string::find((char *)(install_name_1.field_2._8_8_ + 0x30),0x87847b);
        if (lVar5 == 0) {
          install_name._7_1_ = 1;
        }
      }
      else {
        std::__cxx11::string::string((string *)local_b8);
        cmSystemTools::GuessLibraryInstallName
                  ((string *)(install_name_1.field_2._8_8_ + 0x10),(string *)local_b8);
        lVar5 = std::__cxx11::string::find(local_b8,0x8725d6);
        if (lVar5 != -1) {
          install_name._7_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 != SHARED_LIBRARY) {
      return false;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"INSTALL_NAME_DIR",&local_51);
    p_Var3 = (_Base_ptr)GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    local_30 = p_Var3;
    local_65 = MacOSXUseInstallNameDir(this);
    p_Var3 = local_30;
    info._6_1_ = 0;
    info._5_1_ = 0;
    local_2a9 = false;
    if ((local_30 != (_Base_ptr)0x0) && (local_2a9 = false, (bool)local_65)) {
      std::allocator<char>::allocator();
      info._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,(char *)p_Var3,(allocator<char> *)((long)&info + 7));
      info._5_1_ = 1;
      local_2a9 = std::operator==(&local_88,"@rpath");
    }
    if ((info._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((info._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&info + 7));
    }
    if (local_2a9 == false) {
      if ((local_30 != (_Base_ptr)0x0) && ((local_65 & 1) != 0)) {
        return false;
      }
    }
    else {
      install_name._7_1_ = 1;
    }
    if ((install_name._7_1_ & 1) == 0) {
      install_name._6_1_ = MacOSXRpathInstallNameDirDefault(this);
    }
  }
  if (((install_name._7_1_ & 1) == 0) && ((install_name._6_1_ & 1) == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG",&local_d9);
    bVar1 = cmMakefile::IsSet(this_00,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
      std::operator<<((ostream *)&cm,"Attempting to use ");
      if ((install_name._6_1_ & 1) == 0) {
        std::operator<<((ostream *)&cm,"@rpath");
      }
      else {
        std::operator<<((ostream *)&cm,"MACOSX_RPATH");
      }
      std::operator<<((ostream *)&cm," without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.");
      std::operator<<((ostream *)&cm,"  This could be because you are using a Mac OS X version");
      std::operator<<((ostream *)&cm," less than 10.5 or because CMake\'s platform configuration is"
                     );
      std::operator<<((ostream *)&cm," corrupt.");
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      local_260 = (undefined1  [8])this_01;
      std::__cxx11::ostringstream::str();
      GetBacktrace((cmGeneratorTarget *)local_290);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_290 + 0x10),
                          (cmListFileBacktrace *)local_290);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_290);
      std::__cxx11::string::~string((string *)(local_290 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::HasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    const char* install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name &&
        std::string(install_name) == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (info->SOName.find("@rpath/") == 0) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}